

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_parse_headers(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  connectdata *pcVar1;
  char *pcVar2;
  statusline sVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  statusline st_1;
  statusline st;
  size_t consumed;
  void *pvStack_50;
  _Bool leftover_body;
  char *end_ptr;
  SingleRequest *k;
  connectdata *pcStack_38;
  CURLcode result;
  connectdata *conn;
  size_t *pconsumed_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  pcStack_38 = data->conn;
  k._4_4_ = CURLE_OK;
  end_ptr = (char *)&data->req;
  consumed._7_1_ = 0;
  *pconsumed = 0;
  conn = (connectdata *)pconsumed;
  pconsumed_local = (size_t *)blen;
  blen_local = (size_t)buf;
  buf_local = (char *)data;
  while( true ) {
    bVar6 = false;
    if (pconsumed_local != (size_t *)0x0) {
      bVar6 = (*(uint *)(end_ptr + 0xd1) & 1) != 0;
    }
    if (!bVar6) break;
    pvStack_50 = memchr((void *)blen_local,10,(size_t)pconsumed_local);
    if (pvStack_50 == (void *)0x0) {
      k._4_4_ = Curl_dyn_addn((dynbuf *)(buf_local + 0xc20),(void *)blen_local,
                              (size_t)pconsumed_local);
      pcVar2 = buf_local;
      pcVar1 = pcStack_38;
      if (k._4_4_ != CURLE_OK) {
        return k._4_4_;
      }
      (conn->cpool_node)._list =
           (Curl_llist *)((long)pconsumed_local + (long)(conn->cpool_node)._list);
      if (*(int *)(end_ptr + 0x3c) == 0) {
        pcVar4 = Curl_dyn_ptr((dynbuf *)(buf_local + 0xc20));
        sVar5 = Curl_dyn_len((dynbuf *)(buf_local + 0xc20));
        sVar3 = checkprotoprefix((Curl_easy *)pcVar2,pcVar1,pcVar4,sVar5);
        if (sVar3 == STATUS_BAD) {
          *(uint *)(end_ptr + 0xd1) = *(uint *)(end_ptr + 0xd1) & 0xfffffffe;
          Curl_conncontrol(pcStack_38,2);
          if ((9 < (byte)end_ptr[0x51]) || (((ulong)pcStack_38->bits >> 6 & 1) != 0)) {
            Curl_failf((Curl_easy *)buf_local,"Invalid status line");
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if (((byte)buf_local[0x13bb] >> 2 & 1) == 0) {
            Curl_failf((Curl_easy *)buf_local,"Received HTTP/0.9 when not allowed");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          consumed._7_1_ = 1;
        }
      }
      break;
    }
    _st_1 = (long)pvStack_50 + (1 - blen_local);
    k._4_4_ = Curl_dyn_addn((dynbuf *)(buf_local + 0xc20),(void *)blen_local,_st_1);
    pcVar2 = buf_local;
    pcVar1 = pcStack_38;
    if (k._4_4_ != CURLE_OK) {
      return k._4_4_;
    }
    pconsumed_local = (size_t *)((long)pconsumed_local - _st_1);
    blen_local = _st_1 + blen_local;
    (conn->cpool_node)._list = (Curl_llist *)((long)&((conn->cpool_node)._list)->_head + _st_1);
    if (*(int *)(end_ptr + 0x3c) == 0) {
      pcVar4 = Curl_dyn_ptr((dynbuf *)(buf_local + 0xc20));
      sVar5 = Curl_dyn_len((dynbuf *)(buf_local + 0xc20));
      sVar3 = checkprotoprefix((Curl_easy *)pcVar2,pcVar1,pcVar4,sVar5);
      if (sVar3 == STATUS_BAD) {
        Curl_conncontrol(pcStack_38,2);
        if ((9 < (byte)end_ptr[0x51]) || (((ulong)pcStack_38->bits >> 6 & 1) != 0)) {
          Curl_failf((Curl_easy *)buf_local,"Invalid status line");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if (((byte)buf_local[0x13bb] >> 2 & 1) == 0) {
          Curl_failf((Curl_easy *)buf_local,"Received HTTP/0.9 when not allowed");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        *(uint *)(end_ptr + 0xd1) = *(uint *)(end_ptr + 0xd1) & 0xfffffffe;
        consumed._7_1_ = 1;
        break;
      }
    }
    pcVar2 = buf_local;
    pcVar4 = Curl_dyn_ptr((dynbuf *)(buf_local + 0xc20));
    sVar5 = Curl_dyn_len((dynbuf *)(buf_local + 0xc20));
    k._4_4_ = http_rw_hd((Curl_easy *)pcVar2,pcVar4,sVar5,(char *)blen_local,(size_t)pconsumed_local
                         ,(size_t *)&st_1);
    Curl_dyn_reset((dynbuf *)(buf_local + 0xc20));
    if (_st_1 != 0) {
      pconsumed_local = (size_t *)((long)pconsumed_local - _st_1);
      blen_local = _st_1 + blen_local;
      (conn->cpool_node)._list = (Curl_llist *)((long)&((conn->cpool_node)._list)->_head + _st_1);
    }
    if (k._4_4_ != CURLE_OK) {
      return k._4_4_;
    }
  }
  if (((*(uint *)(end_ptr + 0xd1) & 1) == 0) && ((consumed._7_1_ & 1) == 0)) {
    Curl_dyn_free((dynbuf *)(buf_local + 0xc20));
  }
  return CURLE_OK;
}

Assistant:

static CURLcode http_parse_headers(struct Curl_easy *data,
                                   const char *buf, size_t blen,
                                   size_t *pconsumed)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  struct SingleRequest *k = &data->req;
  char *end_ptr;
  bool leftover_body = FALSE;

  /* header line within buffer loop */
  *pconsumed = 0;
  while(blen && k->header) {
    size_t consumed;

    end_ptr = memchr(buf, '\n', blen);
    if(!end_ptr) {
      /* Not a complete header line within buffer, append the data to
         the end of the headerbuff. */
      result = Curl_dyn_addn(&data->state.headerb, buf, blen);
      if(result)
        return result;
      *pconsumed += blen;

      if(!k->headerline) {
        /* check if this looks like a protocol header */
        statusline st =
          checkprotoprefix(data, conn,
                           Curl_dyn_ptr(&data->state.headerb),
                           Curl_dyn_len(&data->state.headerb));

        if(st == STATUS_BAD) {
          /* this is not the beginning of a protocol first header line.
           * Cannot be 0.9 if version was detected or connection was reused. */
          k->header = FALSE;
          streamclose(conn, "bad HTTP: No end-of-message indicator");
          if((k->httpversion >= 10) || conn->bits.reuse) {
            failf(data, "Invalid status line");
            return CURLE_WEIRD_SERVER_REPLY;
          }
          if(!data->state.http_neg.accept_09) {
            failf(data, "Received HTTP/0.9 when not allowed");
            return CURLE_UNSUPPORTED_PROTOCOL;
          }
          leftover_body = TRUE;
          goto out;
        }
      }
      goto out; /* read more and try again */
    }

    /* decrease the size of the remaining (supposed) header line */
    consumed = (end_ptr - buf) + 1;
    result = Curl_dyn_addn(&data->state.headerb, buf, consumed);
    if(result)
      return result;
    blen -= consumed;
    buf += consumed;
    *pconsumed += consumed;

    /****
     * We now have a FULL header line in 'headerb'.
     *****/

    if(!k->headerline) {
      /* the first read header */
      statusline st = checkprotoprefix(data, conn,
                                       Curl_dyn_ptr(&data->state.headerb),
                                       Curl_dyn_len(&data->state.headerb));
      if(st == STATUS_BAD) {
        streamclose(conn, "bad HTTP: No end-of-message indicator");
        /* this is not the beginning of a protocol first header line.
         * Cannot be 0.9 if version was detected or connection was reused. */
        if((k->httpversion >= 10) || conn->bits.reuse) {
          failf(data, "Invalid status line");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        if(!data->state.http_neg.accept_09) {
          failf(data, "Received HTTP/0.9 when not allowed");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        k->header = FALSE;
        leftover_body = TRUE;
        goto out;
      }
    }

    result = http_rw_hd(data, Curl_dyn_ptr(&data->state.headerb),
                        Curl_dyn_len(&data->state.headerb),
                        buf, blen, &consumed);
    /* We are done with this line. We reset because response
     * processing might switch to HTTP/2 and that might call us
     * directly again. */
    Curl_dyn_reset(&data->state.headerb);
    if(consumed) {
      blen -= consumed;
      buf += consumed;
      *pconsumed += consumed;
    }
    if(result)
      return result;
  }

  /* We might have reached the end of the header part here, but
     there might be a non-header part left in the end of the read
     buffer. */
out:
  if(!k->header && !leftover_body) {
    Curl_dyn_free(&data->state.headerb);
  }
  return CURLE_OK;
}